

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppp.cpp
# Opt level: O0

void __thiscall pg::PPPSolver::run(PPPSolver *this)

{
  pointer piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  int *piVar14;
  vector<int,_std::allocator<int>_> *this_00;
  ostream *poVar15;
  vector<int,_std::allocator<int>_> *pvVar16;
  ulong uVar17;
  int local_64;
  vector<int,_std::allocator<int>_> *local_48;
  bool local_21;
  int res;
  uint uStack_1c;
  bool reset;
  int p;
  int i;
  int i_2;
  int i_1;
  PPPSolver *this_local;
  
  lVar10 = Solver::nodecount((Solver *)this);
  iVar8 = Solver::priority((Solver *)this,(int)lVar10 + -1);
  (this->super_PPSolver).max_prio = iVar8;
  uVar11 = (ulong)((this->super_PPSolver).max_prio + 1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar11;
  uVar12 = SUB168(auVar2 * ZEXT816(0x18),0);
  uVar17 = uVar12 + 8;
  if (SUB168(auVar2 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar12) {
    uVar17 = 0xffffffffffffffff;
  }
  puVar13 = (ulong *)operator_new__(uVar17);
  *puVar13 = uVar11;
  pvVar16 = (vector<int,_std::allocator<int>_> *)(puVar13 + 1);
  if (uVar11 != 0) {
    local_48 = pvVar16;
    do {
      std::vector<int,_std::allocator<int>_>::vector(local_48);
      local_48 = local_48 + 1;
    } while (local_48 != pvVar16 + uVar11);
  }
  (this->super_PPSolver).regions = pvVar16;
  uVar11 = Solver::nodecount((Solver *)this);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar11;
  uVar11 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar11);
  (this->super_PPSolver).region = piVar14;
  uVar11 = Solver::nodecount((Solver *)this);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar11;
  uVar11 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar11);
  (this->super_PPSolver).strategy = piVar14;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)((this->super_PPSolver).max_prio + 1);
  uVar11 = SUB168(auVar5 * ZEXT816(4),0);
  if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  piVar14 = (int *)operator_new__(uVar11);
  (this->super_PPSolver).inverse = piVar14;
  for (i = 0; lVar10 = Solver::nodecount((Solver *)this), i < lVar10; i = i + 1) {
    bVar6 = bitset::operator[]((this->super_PPSolver).super_Solver.disabled,(long)i);
    if (bVar6) {
      local_64 = -2;
    }
    else {
      local_64 = Solver::priority((Solver *)this,i);
    }
    (this->super_PPSolver).region[i] = local_64;
  }
  for (p = 0; lVar10 = Solver::nodecount((Solver *)this), p < lVar10; p = p + 1) {
    (this->super_PPSolver).strategy[p] = -1;
  }
  this->reset0 = -1;
  this->reset1 = -1;
  lVar10 = Solver::nodecount((Solver *)this);
  uStack_1c = (int)lVar10 - 1;
  (this->super_PPSolver).promotions = 0;
LAB_001de202:
  while (-1 < (int)uStack_1c) {
    res = Solver::priority((Solver *)this,uStack_1c);
    while( true ) {
      bVar6 = false;
      if (-1 < (int)uStack_1c) {
        uVar9 = Solver::priority((Solver *)this,uStack_1c);
        bVar6 = false;
        if (uVar9 == res) {
          bVar7 = bitset::operator[]((this->super_PPSolver).super_Solver.disabled,
                                     (long)(int)uStack_1c);
          bVar6 = true;
          if (!bVar7) {
            bVar6 = res < (this->super_PPSolver).region[(int)uStack_1c];
          }
        }
      }
      if (!bVar6) break;
      uStack_1c = uStack_1c - 1;
    }
    if ((int)uStack_1c < 0) break;
    uVar9 = Solver::priority((Solver *)this,uStack_1c);
    if (uVar9 == res) {
      (this->super_PPSolver).inverse[res] = uStack_1c;
      if ((res & 1U) == 0) {
        local_21 = res <= this->reset0;
        if (local_21) {
          this->reset0 = res - 2;
        }
      }
      else {
        local_21 = res <= this->reset1;
        if (local_21) {
          this->reset1 = res - 2;
        }
      }
      bVar6 = PPSolver::setupRegion(&this->super_PPSolver,uStack_1c,res,local_21);
      if (bVar6) {
        while( true ) {
          if (1 < (this->super_PPSolver).super_Solver.trace) {
            PPSolver::reportRegion(&this->super_PPSolver,res);
          }
          uVar9 = (*(this->super_PPSolver).super_Solver._vptr_Solver[4])
                            (this,(ulong)uStack_1c,(ulong)(uint)res);
          if (uVar9 == 0xfffffffe) goto LAB_001de3c3;
          if (uVar9 == 0xffffffff) break;
          PPSolver::promote(&this->super_PPSolver,res,uVar9);
          if ((uVar9 & 1) == 0) {
            if (this->reset1 < (int)uVar9) {
              this->reset1 = uVar9 - 1;
            }
          }
          else if (this->reset0 < (int)uVar9) {
            this->reset0 = uVar9 - 1;
          }
          uStack_1c = (this->super_PPSolver).inverse[(int)uVar9];
          res = uVar9;
        }
        PPSolver::setDominion(&this->super_PPSolver,res);
        lVar10 = Solver::nodecount((Solver *)this);
        uStack_1c = (int)lVar10 - 1;
        lVar10 = Solver::nodecount((Solver *)this);
        iVar8 = Solver::priority((Solver *)this,(int)lVar10 + -1);
        this->reset0 = iVar8;
        lVar10 = Solver::nodecount((Solver *)this);
        iVar8 = Solver::priority((Solver *)this,(int)lVar10 + -1);
        this->reset1 = iVar8;
        if ((this->reset0 & 1U) == 0) {
          this->reset1 = this->reset1 + -1;
        }
        else {
          this->reset0 = this->reset0 + -1;
        }
      }
      else {
        while( true ) {
          bVar6 = false;
          if (-1 < (int)uStack_1c) {
            uVar9 = Solver::priority((Solver *)this,uStack_1c);
            bVar6 = uVar9 == res;
          }
          if (!bVar6) break;
          uStack_1c = uStack_1c - 1;
        }
      }
    }
    else {
      bVar6 = std::vector<int,_std::allocator<int>_>::empty((this->super_PPSolver).regions + res);
      if (!bVar6) {
        PPSolver::resetRegion(&this->super_PPSolver,res);
        if ((res & 1U) == 0) {
          this->reset0 = res - 2;
        }
        else {
          this->reset1 = res - 2;
        }
      }
    }
  }
  pvVar16 = (this->super_PPSolver).regions;
  if (pvVar16 != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar1 = pvVar16[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    this_00 = pvVar16 + (long)piVar1;
    while (pvVar16 != this_00) {
      this_00 = this_00 + -1;
      std::vector<int,_std::allocator<int>_>::~vector(this_00);
    }
    operator_delete__(&pvVar16[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,(long)piVar1 * 0x18 + 8);
  }
  piVar14 = (this->super_PPSolver).region;
  if (piVar14 != (int *)0x0) {
    operator_delete__(piVar14);
  }
  piVar14 = (this->super_PPSolver).strategy;
  if (piVar14 != (int *)0x0) {
    operator_delete__(piVar14);
  }
  piVar14 = (this->super_PPSolver).inverse;
  if (piVar14 != (int *)0x0) {
    operator_delete__(piVar14);
  }
  poVar15 = std::operator<<((this->super_PPSolver).super_Solver.logger,"solved with ");
  poVar15 = (ostream *)std::ostream::operator<<(poVar15,(this->super_PPSolver).promotions);
  poVar15 = std::operator<<(poVar15," promotions.");
  std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
  return;
LAB_001de3c3:
  while( true ) {
    bVar6 = false;
    if (-1 < (int)uStack_1c) {
      iVar8 = Solver::priority((Solver *)this,uStack_1c);
      bVar6 = res <= iVar8;
    }
    if (!bVar6) break;
    uStack_1c = uStack_1c - 1;
  }
  goto LAB_001de202;
}

Assistant:

void
PPPSolver::run()
{
    // obtain highest priority and allocate arrays
    max_prio = priority(nodecount()-1);
    regions = new std::vector<int>[max_prio+1];
    region = new int[nodecount()];
    strategy = new int[nodecount()];
    inverse = new int[max_prio+1];

    // initialize arrays
    for (int i=0; i<nodecount(); i++) region[i] = disabled[i] ? -2 : priority(i);
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // initialize reset values
    reset0 = -1;
    reset1 = -1;

    // start loop at last node (highest priority)
    int i = nodecount() - 1;

    // reset statistics
    promotions = 0;

    /**
     * Two loops: the outer (normal) loop, and the inner (promotion-chain) loop.
     * The outer loop does region setup and attractor on the full region.
     * The inner loop only attracts from the promoted region.
     */

    while (i >= 0) {
        // get current priority and skip all disabled/attracted nodes
        int p = priority(i);
        while (i >= 0 and priority(i) == p and (disabled[i] or region[i] > p)) i--;
        if (i < 0) break;

        // if empty, possibly reset and continue with next
        if (priority(i) != p) {
            if (!regions[p].empty()) {
                resetRegion(p);
                // but then we must also reset everything lower...
                if (p&1) reset1 = p-2;
                else reset0 = p-2;
            }
            continue;
        }

        inverse[p] = i;

        // PPP: reset if lower than value
        bool reset = false;
        if (p&1) {
            if (p <= reset1) {
                reset = true;
                reset1 = p-2;
            }
        } else {
            if (p <= reset0) {
                reset = true;
                reset0 = p-2;
            }
        }
        if (setupRegion(i, p, reset)) {
            // region not empty, maybe promote
            while (true) {
                if (trace >= 2) reportRegion(p);
                int res = getRegionStatus(i, p);
                if (res == -2) {
                    // not closed, skip to next priority and break inner loop
                    while (i >= 0 and priority(i) >= p) i--;
                    break;
                } else if (res == -1) {
                    // found dominion, return
                    setDominion(p);
                    // restart algorithm and break inner loop
                    i = nodecount() - 1;
                    reset0 = priority(nodecount()-1);
                    reset1 = priority(nodecount()-1);
                    if (reset0&1) reset0--;
                    else reset1--;
                    break;
                } else {
                    // found promotion, promote
                    promote(p, res);
                    // increase reset value if needed
                    if (res&1) {
                        if (res > reset0) reset0 = res-1;
                    } else {
                        if (res > reset1) reset1 = res-1;
                    }
                    // continue inner loop with higher priority
                    i = inverse[res];
                    p = res;
                }
            }
        } else {
            // skip to next priority
            while (i >= 0 and priority(i) == p) i--;
        }
    }

    delete[] regions;
    delete[] region;
    delete[] strategy;
    delete[] inverse;

    logger << "solved with " << promotions << " promotions." << std::endl;
}